

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O2

void __thiscall camp::Property::~Property(Property *this)

{
  (this->super_TagHolder)._vptr_TagHolder = (_func_int **)&PTR__Property_001412c8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_writable).m_getter.
              super___shared_ptr<camp::detail::GetterInterface<bool>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_readable).m_getter.
              super___shared_ptr<camp::detail::GetterInterface<bool>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&this->m_name);
  TagHolder::~TagHolder(&this->super_TagHolder);
  return;
}

Assistant:

Property::~Property()
{
}